

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

StructReader *
capnp::_::WireHelpers::readStructPointer
          (StructReader *__return_storage_ptr__,SegmentReader *segment,CapTableReader *capTable,
          WirePointer *ref,word *refTarget,word *defaultValue,int nestingLimit)

{
  word *pwVar1;
  WirePointer *capTable_00;
  CapTableReader *pCVar2;
  bool bVar3;
  unsigned_short uVar4;
  unsigned_short uVar5;
  unsigned_short pointerCount;
  WordCountN<17> size;
  Fault local_e8;
  Fault f_2;
  DebugExpression<bool> _kjCondition_2;
  Fault f_1;
  Kind local_c8;
  DebugExpression<capnp::_::WirePointer::Kind> local_c4;
  undefined1 local_c0 [8];
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> _kjCondition_1;
  word *p;
  word *local_90;
  word *_p2192;
  word *ptr;
  Fault local_70;
  Fault f;
  int *local_60;
  undefined1 local_58 [8];
  DebugComparison<int_&,_int> _kjCondition;
  word *defaultValue_local;
  word *refTarget_local;
  WirePointer *ref_local;
  CapTableReader *capTable_local;
  SegmentReader *segment_local;
  
  _kjCondition._32_8_ = defaultValue;
  refTarget_local = (word *)ref;
  ref_local = (WirePointer *)capTable;
  capTable_local = (CapTableReader *)segment;
  bVar3 = WirePointer::isNull(ref);
  defaultValue_local = refTarget;
  if (bVar3) goto LAB_00365731;
  while( true ) {
    local_60 = (int *)kj::_::DebugExpressionStart::operator<<
                                ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&nestingLimit);
    f.exception._4_4_ = 0;
    kj::_::DebugExpression<int&>::operator>
              ((DebugComparison<int_&,_int> *)local_58,(DebugExpression<int&> *)&local_60,
               (int *)((long)&f.exception + 4));
    bVar3 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_58);
    if (bVar3) {
      followFars((WireHelpers *)&p,(WirePointer **)&refTarget_local,defaultValue_local,
                 (SegmentReader **)&capTable_local);
      local_90 = kj::_::readMaybe<capnp::word_const>((Maybe<const_capnp::word_&> *)&p);
      if (local_90 != (word *)0x0) {
        _kjCondition_1._24_8_ = local_90;
        _p2192 = local_90;
        local_c8 = WirePointer::kind((WirePointer *)refTarget_local);
        local_c4 = kj::_::DebugExpressionStart::operator<<
                             ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_c8);
        f_1.exception._4_4_ = 0;
        kj::_::DebugExpression<capnp::_::WirePointer::Kind>::operator==
                  ((DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                   local_c0,&local_c4,(Kind *)((long)&f_1.exception + 4));
        bVar3 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_c0);
        pCVar2 = capTable_local;
        pwVar1 = _p2192;
        if (bVar3) {
          size = WirePointer::StructRef::wordSize
                           ((StructRef *)((long)&refTarget_local->content + 4));
          f_2.exception._6_1_ = boundsCheck((SegmentReader *)pCVar2,pwVar1,size);
          f_2.exception._7_1_ =
               kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                          (bool *)((long)&f_2.exception + 6));
          bVar3 = kj::_::DebugExpression::operator_cast_to_bool
                            ((DebugExpression *)((long)&f_2.exception + 7));
          pCVar2 = capTable_local;
          capTable_00 = ref_local;
          pwVar1 = _p2192;
          if (bVar3) {
            uVar4 = DirectWireValue<unsigned_short>::get
                              ((DirectWireValue<unsigned_short> *)
                               ((long)&refTarget_local->content + 4));
            uVar5 = DirectWireValue<unsigned_short>::get
                              ((DirectWireValue<unsigned_short> *)
                               ((long)&refTarget_local->content + 4));
            pointerCount = DirectWireValue<unsigned_short>::get
                                     ((DirectWireValue<unsigned_short> *)
                                      ((long)&refTarget_local->content + 6));
            StructReader::StructReader
                      (__return_storage_ptr__,(SegmentReader *)pCVar2,(CapTableReader *)capTable_00,
                       pwVar1,(WirePointer *)(pwVar1 + (int)(uint)uVar4),(uint)uVar5 << 6,
                       pointerCount,nestingLimit + -1);
            return __return_storage_ptr__;
          }
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[322]>
                    (&local_e8,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x89e,FAILED,"boundsCheck(segment, ptr, ref->structRef.wordSize())",
                     "_kjCondition,\"Message contained out-of-bounds struct pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                     ,(DebugExpression<bool> *)((long)&f_2.exception + 7),
                     (char (*) [322])
                     "Message contained out-of-bounds struct pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                    );
          kj::_::Debug::Fault::~Fault(&local_e8);
        }
        else {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[87]>
                    ((Fault *)&stack0xffffffffffffff28,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x898,FAILED,"ref->kind() == WirePointer::STRUCT",
                     "_kjCondition,\"Schema mismatch: Message contains non-struct pointer where struct pointer\" \"was expected.\""
                     ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                      local_c0,
                     (char (*) [87])
                     "Schema mismatch: Message contains non-struct pointer where struct pointerwas expected."
                    );
          kj::_::Debug::Fault::~Fault((Fault *)&stack0xffffffffffffff28);
        }
      }
    }
    else {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<int&,int>&,char_const(&)[76]>
                (&local_70,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x88b,FAILED,"nestingLimit > 0",
                 "_kjCondition,\"Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.\""
                 ,(DebugComparison<int_&,_int> *)local_58,
                 (char (*) [76])
                 "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.");
      kj::_::Debug::Fault::~Fault(&local_70);
    }
LAB_00365731:
    if ((_kjCondition._32_8_ == 0) ||
       (bVar3 = WirePointer::isNull((WirePointer *)_kjCondition._32_8_), bVar3)) break;
    capTable_local = (CapTableReader *)0x0;
    refTarget_local = (word *)_kjCondition._32_8_;
    defaultValue_local =
         WirePointer::target((WirePointer *)_kjCondition._32_8_,(SegmentReader *)0x0);
    _kjCondition.result = false;
    _kjCondition._33_7_ = 0;
  }
  StructReader::StructReader(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

static KJ_ALWAYS_INLINE(StructReader readStructPointer(
      SegmentReader* segment, CapTableReader* capTable,
      const WirePointer* ref, const word* refTarget,
      const word* defaultValue, int nestingLimit)) {
    if (ref->isNull()) {
    useDefault:
      if (defaultValue == nullptr ||
          reinterpret_cast<const WirePointer*>(defaultValue)->isNull()) {
        return StructReader();
      }
      segment = nullptr;
      ref = reinterpret_cast<const WirePointer*>(defaultValue);
      refTarget = ref->target(segment);
      defaultValue = nullptr;  // If the default value is itself invalid, don't use it again.
    }

    KJ_REQUIRE(nestingLimit > 0,
               "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.") {
      goto useDefault;
    }

    const word* ptr;
    KJ_IF_SOME(p, followFars(ref, refTarget, segment)) {
      ptr = &p;
    } else {
      goto useDefault;
    }

    KJ_REQUIRE(ref->kind() == WirePointer::STRUCT,
               "Schema mismatch: Message contains non-struct pointer where struct pointer"
               "was expected.") {
      goto useDefault;
    }

    KJ_REQUIRE(boundsCheck(segment, ptr, ref->structRef.wordSize()),
               "Message contained out-of-bounds struct pointer. "
               OUT_OF_BOUNDS_ERROR_DETAIL) {
      goto useDefault;
    }

    return StructReader(
        segment, capTable,
        ptr, reinterpret_cast<const WirePointer*>(ptr + ref->structRef.dataSize.get()),
        ref->structRef.dataSize.get() * BITS_PER_WORD,
        ref->structRef.ptrCount.get(),
        nestingLimit - 1);
  }